

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O3

void __thiscall
QPDF_Array::QPDF_Array
          (QPDF_Array *this,vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *v,
          bool sparse)

{
  pointer pQVar1;
  element_type *peVar2;
  _Head_base<0UL,_QPDF_Array::Sparse_*,_false> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer __p;
  pointer __p_00;
  mapped_type *pmVar5;
  _Rb_tree_header *p_Var6;
  undefined3 in_register_00000011;
  QPDFObjectHandle *item;
  pointer pQVar7;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_38;
  
  (this->elements).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->elements).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sp)._M_t.
  super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
  super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
  super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl = (Sparse *)0x0;
  (this->elements).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if (CONCAT31(in_register_00000011,sparse) == 0) {
    pQVar7 = (v->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    (this->elements).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
    .super__Vector_impl_data._M_start =
         (v->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
         super__Vector_impl_data._M_start;
    (this->elements).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
    .super__Vector_impl_data._M_finish = pQVar7;
    (this->elements).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         (v->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_38.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (v->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (v->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (v->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_38);
  }
  else {
    __p_00 = (pointer)operator_new(0x38);
    p_Var6 = &(__p_00->elements)._M_t._M_impl.super__Rb_tree_header;
    *(undefined8 *)&(__p_00->elements)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    (__p_00->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    *(undefined8 *)__p_00 = 0;
    *(undefined8 *)&(__p_00->elements)._M_t._M_impl = 0;
    (__p_00->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header;
    (__p_00->elements)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var6->_M_header;
    (__p_00->elements)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_38.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::__uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::reset
              ((__uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_> *)this
               ,__p_00);
    std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::~unique_ptr
              ((unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_> *)&local_38
              );
    pQVar1 = (v->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pQVar7 = (v->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                  _M_impl.super__Vector_impl_data._M_start; pQVar7 != pQVar1; pQVar7 = pQVar7 + 1) {
      peVar2 = (pQVar7->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (((peVar2 == (element_type *)0x0) ||
          (*(__index_type *)
            ((long)&(peVar2->value).
                    super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            + 0x30) != '\x02')) || ((peVar2->og).obj != 0)) {
        _Var3._M_head_impl =
             (this->sp)._M_t.
             super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>.
             _M_t.
             super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
             super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
        pmVar5 = std::
                 map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
                 ::operator[](&(_Var3._M_head_impl)->elements,&(_Var3._M_head_impl)->size);
        peVar2 = (pQVar7->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var4 = (pQVar7->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        (pQVar7->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        (pQVar7->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_00 = (pmVar5->super_BaseHandle).obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        (pmVar5->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = peVar2;
        (pmVar5->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var4;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
      }
      _Var3._M_head_impl =
           (this->sp)._M_t.
           super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
           super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
           super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
      (_Var3._M_head_impl)->size = (_Var3._M_head_impl)->size + 1;
    }
  }
  return;
}

Assistant:

QPDF_Array::QPDF_Array(std::vector<QPDFObjectHandle>&& v, bool sparse)
{
    if (sparse) {
        sp = std::make_unique<Sparse>();
        for (auto& item: v) {
            if (item.raw_type_code() != ::ot_null || item.indirect()) {
                sp->elements[sp->size] = std::move(item);
            }
            ++sp->size;
        }
    } else {
        elements = std::move(v);
    }
}